

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  pid_t pVar5;
  gid_t gVar6;
  uid_t uVar7;
  _func_int_sqlite3_file_ptr *p_Var8;
  ulong uVar9;
  sqlite3_io_methods *psVar10;
  uint uVar11;
  __pid_t _Var12;
  int iVar13;
  uint uVar14;
  sqlite3_io_methods *psVar15;
  size_t sVar16;
  int *piVar17;
  char *zFile;
  UnixUnusedFd *p;
  sqlite3_mutex *psVar18;
  mode_t m;
  int iVar19;
  uint f;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  sqlite3_io_methods *psVar23;
  unixInodeInfo **ppuVar24;
  uint uVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  uint local_4a0;
  gid_t local_470;
  uid_t local_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  char zTmpname [514];
  char cStack_249;
  char zDb [513];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = flags & 0xfff00;
  if (((flags & 4U) == 0) ||
     (((bVar4 = true, uVar11 != 0x800 && (uVar11 != 0x4000)) && (uVar11 != 0x80000)))) {
    bVar4 = false;
  }
  memset(zTmpname,0xaa,0x202);
  pVar5 = randomnessPid;
  _Var12 = getpid();
  if (pVar5 != _Var12) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pFile[0xe].pMethods = (sqlite3_io_methods *)0x0;
  pcVar20 = zPath;
  if (uVar11 == 0x100) {
    psVar15 = (sqlite3_io_methods *)findReusableFd(zPath,flags);
    if (psVar15 == (sqlite3_io_methods *)0x0) {
      psVar15 = (sqlite3_io_methods *)sqlite3_malloc64(0x10);
      if (psVar15 == (sqlite3_io_methods *)0x0) {
        iVar13 = 7;
        goto LAB_0011fbe7;
      }
      uVar14 = 0xffffffff;
    }
    else {
      uVar14 = psVar15->iVersion;
    }
    pFile[6].pMethods = psVar15;
  }
  else {
    uVar14 = 0xffffffff;
    if (zPath == (char *)0x0) {
      uVar14 = 0xffffffff;
      iVar13 = unixGetTempname(pVfs->mxPathname,zTmpname);
      pcVar20 = zTmpname;
      if (iVar13 != 0) goto LAB_0011fbe7;
    }
  }
  uVar22 = flags & 8;
  local_4a0 = flags & 1;
  if ((int)uVar14 < 0) {
    local_468 = local_468 & 0xffffffff00000000;
    local_46c = 0;
    local_470 = 0;
    uVar25 = flags & 0x80800;
    local_4a0 = flags & 1;
    if (uVar25 == 0) {
      m = 0x180;
      if ((uVar22 == 0) && (m = 0, (flags & 0x40U) != 0)) {
        zFile = sqlite3_uri_parameter(pcVar20,"modeof");
        m = 0;
        if (zFile != (char *)0x0) goto LAB_0011f91f;
      }
    }
    else {
      memset(zDb,0xaa,0x201);
      uVar14 = sqlite3Strlen30(pcVar20);
      iVar13 = 0;
      uVar9 = (ulong)uVar14;
      do {
        uVar21 = uVar9;
        if (((long)uVar21 < 2) || (pcVar20[uVar21 - 1] == '.')) goto LAB_0011f927;
        uVar9 = uVar21 - 1;
      } while (pcVar20[uVar21 - 1] != '-');
      zFile = zDb;
      __memcpy_chk(zFile,pcVar20,uVar21 - 1,0x201);
      zDb[uVar21 - 1] = '\0';
LAB_0011f91f:
      iVar13 = getFileMode(zFile,(mode_t *)&local_468,&local_46c,&local_470);
LAB_0011f927:
      if (iVar13 != 0) goto LAB_0011fbe7;
      m = (mode_t)local_468;
    }
    f = (flags & 2U) + (flags & 4U) * 0x10 + (flags & 0x10U) * 8 + 0x20000;
    uVar14 = robust_open(pcVar20,f,m);
    if (-1 < (int)uVar14) {
LAB_0011f979:
      uVar7 = local_46c;
      gVar6 = local_470;
      if ((uVar25 != 0 && m != 0) && (iVar13 = (*aSyscall[0x15].pCurrent)(), iVar13 == 0)) {
        (*aSyscall[0x14].pCurrent)((ulong)uVar14,uVar7,(ulong)gVar6);
      }
      goto LAB_0011f64c;
    }
    piVar17 = __errno_location();
    if ((bVar4) && (*piVar17 == 0xd)) {
      bVar3 = false;
      iVar13 = (*aSyscall[2].pCurrent)(pcVar20,0);
      if (iVar13 == 0) goto LAB_0011fa1d;
      iVar13 = 0x608;
    }
    else {
LAB_0011fa1d:
      bVar3 = true;
      iVar13 = 0;
      if (((flags & 2U) != 0) && (*piVar17 != 0x15)) {
        flags = (flags & 0xfffffff8U) + 1;
        p = findReusableFd(pcVar20,flags);
        if (p == (UnixUnusedFd *)0x0) {
          uVar14 = robust_open(pcVar20,f & 0x20080,m);
        }
        else {
          uVar14 = p->fd;
          sqlite3_free(p);
        }
        iVar13 = 0;
        if (-1 < (int)uVar14) {
          local_4a0 = 1;
          goto LAB_0011f979;
        }
      }
    }
    iVar19 = sqlite3CantopenError(0xafc2);
    unixLogErrorAtLine(iVar19,"open",pcVar20,0xafc2);
    if (bVar3) {
      iVar13 = iVar19;
    }
LAB_0011fbde:
    sqlite3_free(pFile[6].pMethods);
  }
  else {
LAB_0011f64c:
    if (pOutFlags != (int *)0x0) {
      *pOutFlags = flags;
    }
    psVar15 = pFile[6].pMethods;
    if (psVar15 != (sqlite3_io_methods *)0x0) {
      psVar15->iVersion = uVar14;
      *(uint *)&psVar15->field_0x4 = flags & 3;
    }
    if (uVar22 != 0) {
      (*aSyscall[0x10].pCurrent)(pcVar20);
    }
    uVar25 = uVar22 * 4 + 2;
    if (local_4a0 == 0) {
      uVar25 = uVar22 * 4;
    }
    uVar22 = uVar25 + 0x80;
    if (uVar11 == 0x100) {
      uVar22 = uVar25;
    }
    uVar11 = uVar22 | 8;
    if (!bVar4) {
      uVar11 = uVar22;
    }
    *(uint *)&pFile[3].pMethods = uVar14;
    pFile[1].pMethods = (sqlite3_io_methods *)pVfs;
    pFile[7].pMethods = (sqlite3_io_methods *)zPath;
    *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(flags & 0x40U) | (ushort)uVar11;
    pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
    pcVar20 = (char *)0x0;
    if ((flags & 0x40U) != 0 || (uVar11 & 0x40) != 0) {
      pcVar20 = zPath;
    }
    iVar13 = sqlite3_uri_boolean(pcVar20,"psow",1);
    if (iVar13 != 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar13 = strcmp(pVfs->zName,"unix-excl");
    if (iVar13 == 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((char)uVar11 < '\0') {
      psVar15 = &nolockIoMethods;
LAB_0011f7b1:
      *(undefined4 *)&pFile[4].pMethods = 0;
    }
    else {
      psVar15 = (sqlite3_io_methods *)(**pVfs->pAppData)(zPath,pFile);
      psVar23 = &posixIoMethods;
      if (psVar15 == &posixIoMethods) {
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
        }
        memset(zDb,0xaa,0x90);
        iVar13 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,zDb);
        if (iVar13 == 0) {
          local_468._0_1_ = zDb[0];
          local_468._1_1_ = zDb[1];
          local_468._2_1_ = zDb[2];
          local_468._3_1_ = zDb[3];
          local_468._4_1_ = zDb[4];
          local_468._5_1_ = zDb[5];
          local_468._6_1_ = zDb[6];
          local_468._7_1_ = zDb[7];
          uVar9 = local_468;
          uStack_460 = (_func_int_sqlite3_file_ptr *)zDb._8_8_;
          p_Var8 = uStack_460;
          ppuVar24 = &inodeList;
          while (psVar15 = (sqlite3_io_methods *)*ppuVar24, local_468 = uVar9, uStack_460 = p_Var8,
                psVar15 != (sqlite3_io_methods *)0x0) {
            local_468._0_1_ = (char)zDb._0_8_;
            local_468._1_1_ = SUB81(zDb._0_8_,1);
            local_468._2_1_ = SUB81(zDb._0_8_,2);
            local_468._3_1_ = SUB81(zDb._0_8_,3);
            local_468._4_1_ = SUB81(zDb._0_8_,4);
            local_468._5_1_ = SUB81(zDb._0_8_,5);
            local_468._6_1_ = SUB81(zDb._0_8_,6);
            local_468._7_1_ = SUB81(zDb._0_8_,7);
            uStack_460._0_1_ = (char)zDb._8_8_;
            uStack_460._1_1_ = SUB81(zDb._8_8_,1);
            uStack_460._2_1_ = SUB81(zDb._8_8_,2);
            uStack_460._3_1_ = SUB81(zDb._8_8_,3);
            uStack_460._4_1_ = SUB81(zDb._8_8_,4);
            uStack_460._5_1_ = SUB81(zDb._8_8_,5);
            uStack_460._6_1_ = SUB81(zDb._8_8_,6);
            uStack_460._7_1_ = SUB81(zDb._8_8_,7);
            auVar26[0] = -((char)((unixFileId *)&psVar15->iVersion)->dev == (char)local_468);
            auVar26[1] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 1) ==
                          local_468._1_1_);
            auVar26[2] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 2) ==
                          local_468._2_1_);
            auVar26[3] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 3) ==
                          local_468._3_1_);
            auVar26[4] = -(psVar15->field_0x4 == local_468._4_1_);
            auVar26[5] = -(psVar15->field_0x5 == local_468._5_1_);
            auVar26[6] = -(psVar15->field_0x6 == local_468._6_1_);
            auVar26[7] = -(psVar15->field_0x7 == local_468._7_1_);
            auVar26[8] = -(*(char *)&psVar15->xClose == (char)uStack_460);
            auVar26[9] = -(*(char *)((long)&psVar15->xClose + 1) == uStack_460._1_1_);
            auVar26[10] = -(*(char *)((long)&psVar15->xClose + 2) == uStack_460._2_1_);
            auVar26[0xb] = -(*(char *)((long)&psVar15->xClose + 3) == uStack_460._3_1_);
            auVar26[0xc] = -(*(char *)((long)&psVar15->xClose + 4) == uStack_460._4_1_);
            auVar26[0xd] = -(*(char *)((long)&psVar15->xClose + 5) == uStack_460._5_1_);
            auVar26[0xe] = -(*(char *)((long)&psVar15->xClose + 6) == uStack_460._6_1_);
            auVar26[0xf] = -(*(char *)((long)&psVar15->xClose + 7) == uStack_460._7_1_);
            if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
              *(int *)&psVar15->xFileSize = *(int *)&psVar15->xFileSize + 1;
              psVar10 = (sqlite3_io_methods *)inodeList;
              goto LAB_0011fb44;
            }
            ppuVar24 = (unixInodeInfo **)&psVar15->xUnlock;
          }
          psVar15 = (sqlite3_io_methods *)sqlite3_malloc64(0x50);
          iVar13 = 7;
          if (psVar15 == (sqlite3_io_methods *)0x0) goto LAB_0011f8c7;
          *(undefined1 (*) [16])&psVar15->xUnlock = (undefined1  [16])0x0;
          psVar15->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
          psVar15->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
          psVar15->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
          psVar15->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
          *(undefined1 (*) [16])&psVar15->xRead = (undefined1  [16])0x0;
          psVar15->iVersion = 0;
          *(undefined4 *)&psVar15->field_0x4 = 0;
          psVar15->xClose = (_func_int_sqlite3_file_ptr *)0x0;
          *(ulong *)psVar15 = local_468;
          psVar15->xClose = uStack_460;
          if (sqlite3Config.bCoreMutex != '\0') {
            psVar18 = sqlite3_mutex_alloc(0);
            psVar15->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)psVar18;
            if (psVar18 == (sqlite3_mutex *)0x0) {
              sqlite3_free(psVar15);
              goto LAB_0011f8c7;
            }
          }
          *(int *)&psVar15->xFileSize = 1;
          psVar15->xUnlock = (_func_int_sqlite3_file_ptr_int *)inodeList;
          psVar15->xCheckReservedLock = (_func_int_sqlite3_file_ptr_int_ptr *)0x0;
          psVar10 = psVar15;
          if (inodeList != (unixInodeInfo *)0x0) {
            inodeList->pPrev = (unixInodeInfo *)psVar15;
          }
LAB_0011fb44:
          inodeList = (unixInodeInfo *)psVar10;
          pFile[2].pMethods = psVar15;
          iVar13 = 0;
        }
        else {
          piVar17 = __errno_location();
          *(int *)&pFile[4].pMethods = *piVar17;
          iVar13 = 10;
LAB_0011f8c7:
          robust_close((unixFile *)pFile,uVar14,0xadad);
          uVar14 = 0xffffffff;
        }
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
        }
      }
      else {
        psVar23 = &dotlockIoMethods;
        if (psVar15 != &dotlockIoMethods) goto LAB_0011f7b1;
        sVar16 = strlen(zPath);
        iVar19 = (int)sVar16 + 6;
        psVar15 = (sqlite3_io_methods *)sqlite3_malloc64((long)iVar19);
        if (psVar15 == (sqlite3_io_methods *)0x0) {
          iVar13 = 7;
        }
        else {
          iVar13 = 0;
          sqlite3_snprintf(iVar19,(char *)psVar15,"%s.lock",zPath);
        }
        pFile[5].pMethods = psVar15;
      }
      *(undefined4 *)&pFile[4].pMethods = 0;
      psVar15 = psVar23;
      if (iVar13 != 0) {
        if (-1 < (int)uVar14) {
          robust_close((unixFile *)pFile,uVar14,0xae02);
        }
        goto LAB_0011fbde;
      }
    }
    pFile->pMethods = psVar15;
    verifyDbFile((unixFile *)pFile);
    iVar13 = 0;
  }
LAB_0011fbe7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar13;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0x0FFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a super- or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_SUPER_JOURNAL
     || eType==SQLITE_OPEN_MAIN_JOURNAL
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true:
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and super-journal are never
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_SUPER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_SUPER_JOURNAL
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

#ifdef SQLITE_ASSERT_NO_FILES
  /* Applications that never read or write a persistent disk files */
  assert( zName==0 );
#endif

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY|O_NOFOLLOW);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        UnixUnusedFd *pReadonly = 0;
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        pReadonly = findReusableFd(zName, flags);
        if( pReadonly ){
          fd = pReadonly->fd;
          sqlite3_free(pReadonly);
        }else{
          fd = robust_open(zName, openFlags, openMode);
        }
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* The owner of the rollback journal or WAL file should always be the
    ** same as the owner of the database file.  Try to ensure that this is
    ** the case.  The chown() system call will be a no-op if the current
    ** process lacks root privileges, be we should at least try.  Without
    ** this step, if a root process opens a database file, it can leave
    ** behinds a journal/WAL that is owned by root and hence make the
    ** database inaccessible to unprivileged processes.
    **
    ** If openMode==0, then that means uid and gid are not set correctly
    ** (probably because SQLite is configured to use 8+3 filename mode) and
    ** in that case we do not want to attempt the chown().
    */
    if( openMode && (flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL))!=0 ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags =
                          flags & (SQLITE_OPEN_READONLY|SQLITE_OPEN_READWRITE);
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile
          ** and clear all the structure's references.  Specifically,
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif

  assert( zPath==0 || zPath[0]=='/'
      || eType==SQLITE_OPEN_SUPER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}